

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ast.cpp
# Opt level: O3

void __thiscall Ast::print_recursive(Ast *this,Node *current_node,size_t level)

{
  pointer pcVar1;
  size_t sVar2;
  _Alloc_hider _Var3;
  char *__end;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  if (current_node == (Node *)0x0) {
    return;
  }
  if (level != 0) {
    sVar2 = level;
    do {
      local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_370,"  ","");
      cout_log(&local_370);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_370._M_dataplus._M_p != &local_370.field_2) {
        operator_delete(local_370._M_dataplus._M_p);
      }
      sVar2 = sVar2 - 1;
    } while (sVar2 != 0);
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"+-","");
  cout_log(&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  switch(current_node->type) {
  case PROG:
    paVar4 = &local_70.field_2;
    local_70._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"PROG","");
    cout_log(&local_70);
    _Var3._M_p = local_70._M_dataplus._M_p;
    break;
  case EXPR:
    paVar4 = &local_90.field_2;
    local_90._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"EXPR","");
    cout_log(&local_90);
    _Var3._M_p = local_90._M_dataplus._M_p;
    break;
  case DCLRT:
    paVar4 = &local_b0.field_2;
    local_b0._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"DCLRT","");
    cout_log(&local_b0);
    _Var3._M_p = local_b0._M_dataplus._M_p;
    break;
  case SEQ:
    paVar4 = &local_d0.field_2;
    local_d0._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"SEQ","");
    cout_log(&local_d0);
    _Var3._M_p = local_d0._M_dataplus._M_p;
    break;
  case SET:
    paVar4 = &local_f0.field_2;
    local_f0._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"SET","");
    cout_log(&local_f0);
    _Var3._M_p = local_f0._M_dataplus._M_p;
    break;
  case IF:
    paVar4 = &local_110.field_2;
    local_110._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"IF","");
    cout_log(&local_110);
    _Var3._M_p = local_110._M_dataplus._M_p;
    break;
  case ELSE:
    paVar4 = &local_130.field_2;
    local_130._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"ELSE","");
    cout_log(&local_130);
    _Var3._M_p = local_130._M_dataplus._M_p;
    break;
  case FOR:
    paVar4 = &local_150.field_2;
    local_150._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"FOR","");
    cout_log(&local_150);
    _Var3._M_p = local_150._M_dataplus._M_p;
    break;
  case VARIABLE:
    local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"VARIABLE ","");
    cout_log(&local_170);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p);
    }
    local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"(","");
    cout_log(&local_190);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p != &local_190.field_2) {
      operator_delete(local_190._M_dataplus._M_p);
    }
    pcVar1 = (current_node->value)._M_dataplus._M_p;
    local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1b0,pcVar1,pcVar1 + (current_node->value)._M_string_length);
    cout_log(&local_1b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
      operator_delete(local_1b0._M_dataplus._M_p);
    }
    paVar4 = &local_1d0.field_2;
    local_1d0._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,")","");
    cout_log(&local_1d0);
    _Var3._M_p = local_1d0._M_dataplus._M_p;
    break;
  case NUMBER:
    local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"NUMBER ","");
    cout_log(&local_1f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p);
    }
    local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"(","");
    cout_log(&local_210);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p);
    }
    pcVar1 = (current_node->value)._M_dataplus._M_p;
    local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_230,pcVar1,pcVar1 + (current_node->value)._M_string_length);
    cout_log(&local_230);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      operator_delete(local_230._M_dataplus._M_p);
    }
    paVar4 = &local_250.field_2;
    local_250._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,")","");
    cout_log(&local_250);
    _Var3._M_p = local_250._M_dataplus._M_p;
    break;
  case MORE:
    paVar4 = &local_270.field_2;
    local_270._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"MORE","");
    cout_log(&local_270);
    _Var3._M_p = local_270._M_dataplus._M_p;
    break;
  case LESS:
    paVar4 = &local_290.field_2;
    local_290._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"LESS","");
    cout_log(&local_290);
    _Var3._M_p = local_290._M_dataplus._M_p;
    break;
  case EQUALITY:
    paVar4 = &local_2b0.field_2;
    local_2b0._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"EQUALITY","");
    cout_log(&local_2b0);
    _Var3._M_p = local_2b0._M_dataplus._M_p;
    break;
  case ADD:
    paVar4 = &local_2d0.field_2;
    local_2d0._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"ADD","");
    cout_log(&local_2d0);
    _Var3._M_p = local_2d0._M_dataplus._M_p;
    break;
  case SUB:
    paVar4 = &local_2f0.field_2;
    local_2f0._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"SUB","");
    cout_log(&local_2f0);
    _Var3._M_p = local_2f0._M_dataplus._M_p;
    break;
  case MUL:
    paVar4 = &local_310.field_2;
    local_310._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"MUL","");
    cout_log(&local_310);
    _Var3._M_p = local_310._M_dataplus._M_p;
    break;
  case DIV:
    paVar4 = &local_330.field_2;
    local_330._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_330,"DIV","");
    cout_log(&local_330);
    _Var3._M_p = local_330._M_dataplus._M_p;
    break;
  case PRINTLN:
    paVar4 = &local_350.field_2;
    local_350._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_350,"PRINTLN","");
    cout_log(&local_350);
    _Var3._M_p = local_350._M_dataplus._M_p;
    break;
  default:
    goto switchD_00103130_default;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var3._M_p != paVar4) {
    operator_delete(_Var3._M_p);
  }
switchD_00103130_default:
  endl_log();
  sVar2 = level + 1;
  print_recursive(this,current_node->operand1,sVar2);
  print_recursive(this,current_node->operand2,sVar2);
  print_recursive(this,current_node->operand3,sVar2);
  print_recursive(this,current_node->operand4,sVar2);
  return;
}

Assistant:

void Ast::print_recursive(Node* current_node, size_t level)
{
	if (current_node == nullptr) {
		return;
	}

	for (int i = 0; i < level; ++i) {
		cout_log("  ");
	}

	cout_log("+-");

	switch (current_node->type){
		case node_type::PROG:{
			cout_log("PROG");
			break;
		}
		case node_type::EXPR:{
			cout_log("EXPR");
			break;
		}
		case node_type::DCLRT: {
			cout_log("DCLRT");
			break;
		}
		case node_type::SEQ: {
			cout_log("SEQ");
			break;
		}
		case node_type::SET: {
			cout_log("SET");
			break;
		}
		case node_type::IF: {
			cout_log("IF");
			break;
		}
		case node_type::ELSE: {
			cout_log("ELSE");
			break;
		}
		case node_type::FOR: {
			cout_log("FOR");
			break;
		}
		case node_type::VARIABLE: {
			cout_log("VARIABLE ");
			cout_log("(");
			cout_log(current_node->value);
			cout_log(")");
			break;
		}
		case node_type::NUMBER:{
			cout_log("NUMBER ");
			cout_log("(");
			cout_log(current_node->value);
			cout_log(")");
			break;
		}
		case node_type::MORE: {
			cout_log("MORE");
			break;
		}
		case node_type::LESS: {
			cout_log("LESS");
			break;
		}
		case node_type::EQUALITY: {
			cout_log("EQUALITY");
			break;
		}
		case node_type::ADD:{
			cout_log("ADD");
			break;
		}
		case node_type::SUB:{
			cout_log("SUB");
			break;
		}
		case node_type::MUL:{
			cout_log("MUL");
			break;
		}
		case node_type::DIV:{
			cout_log("DIV");
			break;
		}
		case node_type::PRINTLN: {
			cout_log("PRINTLN");
			break;
		}
	}

	endl_log();

	print_recursive(current_node->operand1, level + 1);
	print_recursive(current_node->operand2, level + 1);
	print_recursive(current_node->operand3, level + 1);
	print_recursive(current_node->operand4, level + 1);

}